

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Token * __thiscall wabt::WastParser::Consume(Token *__return_storage_ptr__,WastParser *this)

{
  optional<wabt::Token> *poVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 uVar9;
  size_t sVar10;
  char *pcVar11;
  
  bVar4 = (this->tokens_).i;
  if ((this->tokens_).tokens._M_elems[bVar4].super__Optional_base<wabt::Token,_true,_true>.
      _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged != false) {
    poVar1 = (this->tokens_).tokens._M_elems + bVar4;
    sVar5 = *(size_t *)
             &(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
              super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc;
    pcVar6 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload._M_value.loc + 8
                       );
    psVar2 = (size_t *)
             ((long)&(this->tokens_).tokens._M_elems[bVar4].
                     super__Optional_base<wabt::Token,_true,_true>._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x10);
    sVar7 = *psVar2;
    sVar8 = psVar2[1];
    puVar3 = (undefined8 *)
             ((long)&(this->tokens_).tokens._M_elems[bVar4].
                     super__Optional_base<wabt::Token,_true,_true>._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x20);
    uVar9 = *puVar3;
    sVar10 = puVar3[1];
    puVar3 = (undefined8 *)
             ((long)&(this->tokens_).tokens._M_elems[bVar4].
                     super__Optional_base<wabt::Token,_true,_true>._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x30);
    pcVar11 = (char *)puVar3[1];
    (__return_storage_ptr__->field_2).text_._M_str = (char *)*puVar3;
    (__return_storage_ptr__->field_2).literal_.text._M_str = pcVar11;
    *(undefined8 *)&__return_storage_ptr__->token_type_ = uVar9;
    (__return_storage_ptr__->field_2).text_._M_len = sVar10;
    (__return_storage_ptr__->loc).field_1.field_1.offset = sVar7;
    *(size_t *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = sVar8;
    (__return_storage_ptr__->loc).filename._M_len = sVar5;
    (__return_storage_ptr__->loc).filename._M_str = pcVar6;
    TokenQueue::pop_front(&this->tokens_);
    return __return_storage_ptr__;
  }
  __assert_fail("!tokens_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0x29c,"Token wabt::WastParser::Consume()");
}

Assistant:

bool WastParser::TokenQueue::empty() const {
  return !tokens[i];
}